

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

Promise<void> __thiscall
capnp::_::TestInterfaceImpl::getTestMoreStuff
          (TestInterfaceImpl *this,GetTestMoreStuffContext context)

{
  CapTableBuilder *pCVar1;
  ClientHook *pCVar2;
  long *plVar3;
  long *in_RDX;
  Own<capnp::ClientHook,_std::nullptr_t> OVar4;
  PointerBuilder local_98;
  Fault local_78;
  SegmentBuilder *local_70;
  Own<capnp::ClientHook,_std::nullptr_t> OStack_68;
  kj local_58;
  undefined7 uStack_57;
  long *local_50;
  StructBuilder local_40;
  
  local_58 = (kj)0x0;
  (**(code **)(*in_RDX + 0x10))(&local_70);
  local_98.pointer = (WirePointer *)OStack_68.ptr;
  local_98.segment = local_70;
  local_98.capTable = (CapTableBuilder *)OStack_68.disposer;
  PointerBuilder::getStruct(&local_40,&local_98,(StructSize)0x10000,(word *)0x0);
  if (context.hook[2]._vptr_CallContextHook != (_func_int **)0x0) {
    kj::heap<capnp::_::TestMoreStuffImpl,int&,int&>
              (&local_58,(int *)context.hook[1]._vptr_CallContextHook,
               (int *)context.hook[2]._vptr_CallContextHook);
    local_98.segment = (SegmentBuilder *)CONCAT71(uStack_57,local_58);
    local_98.capTable = (CapTableBuilder *)((long)local_50 + 0x30);
    if (local_50 == (long *)0x0) {
      local_98.capTable = (CapTableBuilder *)0x0;
    }
    local_50 = (long *)0x0;
    OVar4 = Capability::Client::makeLocalClient
                      ((Client *)&OStack_68,
                       (Own<capnp::Capability::Server,_std::nullptr_t> *)&local_98);
    pCVar1 = local_98.capTable;
    if (local_98.capTable != (CapTableBuilder *)0x0) {
      local_98.capTable = (CapTableBuilder *)0x0;
      (*(code *)(((local_98.segment)->super_SegmentReader).arena)->_vptr_Arena)
                (local_98.segment,
                 (pCVar1->super_CapTableReader)._vptr_CapTableReader[-2] +
                 (long)&(pCVar1->super_CapTableReader)._vptr_CapTableReader,OVar4.ptr);
    }
    local_70 = (SegmentBuilder *)&capnproto_test::capnp::test::TestMoreStuff::Client::typeinfo;
    local_98.segment = local_40.segment;
    local_98.capTable = local_40.capTable;
    local_98.pointer = local_40.pointers;
    PointerBuilder::setCapability(&local_98,&OStack_68);
    pCVar2 = OStack_68.ptr;
    if (OStack_68.ptr != (ClientHook *)0x0) {
      OStack_68.ptr = (ClientHook *)0x0;
      (**((CapTableReader *)&(OStack_68.disposer)->_vptr_Disposer)->_vptr_CapTableReader)
                (OStack_68.disposer,
                 (long)&((WireValue<uint32_t>_conflict *)&pCVar2->_vptr_ClientHook)->value +
                 *(long *)(*(long *)&pCVar2->_vptr_ClientHook + -0x10));
    }
    plVar3 = local_50;
    if (local_50 != (long *)0x0) {
      local_50 = (long *)0x0;
      (*(code *)**(undefined8 **)CONCAT71(uStack_57,local_58))
                ((undefined8 *)CONCAT71(uStack_57,local_58),
                 (long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
    kj::_::readyNow();
    (this->super_Server)._vptr_Server = (_func_int **)local_40.segment;
    return (PromiseBase)(PromiseBase)this;
  }
  local_78.exception = (Exception *)0x0;
  local_98.segment = (SegmentBuilder *)0x0;
  local_98.capTable = (CapTableBuilder *)0x0;
  kj::_::Debug::Fault::init
            (&local_78,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
            );
  kj::_::Debug::Fault::fatal(&local_78);
}

Assistant:

kj::Promise<void> TestInterfaceImpl::getTestMoreStuff(GetTestMoreStuffContext context) {
  context.getResults().setCap(
      kj::heap<TestMoreStuffImpl>(callCount, KJ_REQUIRE_NONNULL(handleCount)));
  return kj::READY_NOW;
}